

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O0

void __thiscall
script_segwit_tests::IsWitnessProgram_Invalid_Nop::test_method(IsWitnessProgram_Invalid_Nop *this)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  __extent_storage<18446744073709551615UL> this_00;
  CScript *line_num;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> program;
  CScript nowit;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  size_type in_stack_fffffffffffffef0;
  const_string *msg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffef8;
  opcodetype opcode;
  const_string *file;
  const_string local_d0 [2];
  lazy_ostream local_b0 [2];
  assertion_result local_90 [4];
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffec8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
  opcode = (opcodetype)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffec8);
  file = (const_string *)&stack0xffffffffffffffd8;
  CScript::CScript((CScript *)in_stack_fffffffffffffec8);
  this_00._M_extent_value = (size_t)CScript::operator<<((CScript *)file,opcode);
  line_num = CScript::operator<<((CScript *)file,opcode);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  b._M_extent._M_extent_value = this_00._M_extent_value;
  b._M_ptr = (pointer)file;
  CScript::operator<<((CScript *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),b);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffec8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00._M_extent_value,file,(size_t)line_num,msg);
    in_stack_fffffffffffffeef =
         anon_unknown_20::IsNoWitnessProgram
                   ((CScript *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               (bool)in_stack_fffffffffffffed7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffec8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    in_stack_fffffffffffffec8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_90,local_b0,local_d0,0x8b,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffec8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffec8);
    in_stack_fffffffffffffedf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffedf);
  CScript::~CScript((CScript *)in_stack_fffffffffffffec8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsWitnessProgram_Invalid_Nop)
{
    std::vector<unsigned char> program(10);
    CScript nowit;
    nowit << OP_0 << OP_NOP << program;
    BOOST_CHECK(IsNoWitnessProgram(nowit));
}